

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

_Bool IsPipeliningPossible(Curl_easy *handle,connectdata *conn)

{
  _Bool _Var1;
  
  if (((conn->handler->protocol & 3) != 0) &&
     (((conn->bits).protoconnstart != true || ((conn->bits).close == false)))) {
    _Var1 = Curl_pipeline_wanted(handle->multi,1);
    if ((_Var1) &&
       (((handle->set).httpversion != 1 && (((handle->set).httpreq | HTTPREQ_PUT) == HTTPREQ_HEAD)))
       ) {
      return true;
    }
    _Var1 = Curl_pipeline_wanted(handle->multi,2);
    if ((_Var1) && (2 < (handle->set).httpversion)) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool IsPipeliningPossible(const struct Curl_easy *handle,
                                 const struct connectdata *conn)
{
  /* If a HTTP protocol and pipelining is enabled */
  if((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
     (!conn->bits.protoconnstart || !conn->bits.close)) {

    if(Curl_pipeline_wanted(handle->multi, CURLPIPE_HTTP1) &&
       (handle->set.httpversion != CURL_HTTP_VERSION_1_0) &&
       (handle->set.httpreq == HTTPREQ_GET ||
        handle->set.httpreq == HTTPREQ_HEAD))
      /* didn't ask for HTTP/1.0 and a GET or HEAD */
      return TRUE;

    if(Curl_pipeline_wanted(handle->multi, CURLPIPE_MULTIPLEX) &&
       (handle->set.httpversion >= CURL_HTTP_VERSION_2))
      /* allows HTTP/2 */
      return TRUE;
  }
  return FALSE;
}